

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

int av1_calc_arf_boost(TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,PRIMARY_RATE_CONTROL *p_rc,
                      FRAME_INFO *frame_info,int offset,int f_frames,int b_frames,
                      int *num_fpstats_used,int *num_fpstats_required,int project_gfu_boost)

{
  FIRSTPASS_STATS *pFVar1;
  int iVar2;
  FIRSTPASS_STATS *pFVar3;
  TWO_PASS *pTVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  GF_GROUP_STATS local_c8;
  
  local_c8.gf_group_skip_pct = 0.0;
  local_c8.gf_group_inactive_zone_rows = 0.0;
  local_c8.gf_group_err = 0.0;
  local_c8.gf_group_raw_error = 0.0;
  local_c8.mv_ratio_accumulator = 0.0;
  local_c8.decay_accumulator = 1.0;
  local_c8.zero_motion_accumulator = 1.0;
  local_c8.loop_decay_rate = 1.0;
  local_c8.last_loop_decay_rate = 1.0;
  local_c8.this_frame_mv_in_out = 0.0;
  local_c8.mv_in_out_accumulator = 0.0;
  local_c8.abs_mv_in_out_accumulator = 0.0;
  local_c8.avg_sr_coded_error = 0.0;
  local_c8.avg_pcnt_second_ref = 0.0;
  local_c8.avg_new_mv_count = 0.0;
  local_c8.avg_wavelet_energy = 0.0;
  local_c8.avg_raw_err_stdev = 0.0;
  local_c8.non_zero_stdev_count = 0;
  if (num_fpstats_used != (int *)0x0) {
    *num_fpstats_used = 0;
  }
  lVar9 = (long)offset;
  if (f_frames < 1) {
    iVar7 = 100;
  }
  else {
    uVar11 = (ulong)(uint)f_frames;
    lVar12 = lVar9 * 0xe8;
    dVar13 = 100.0;
    lVar10 = lVar9;
    do {
      pFVar3 = twopass_frame->stats_in;
      pFVar1 = (FIRSTPASS_STATS *)((long)&pFVar3->frame + lVar12);
      pTVar4 = (TWO_PASS *)twopass->stats_buf_ctx;
      if (lVar10 < 0) {
        if (pFVar1 < *(FIRSTPASS_STATS **)pTVar4) break;
      }
      else if (pTVar4->frame_stats_arr[0] <= pFVar1) break;
      if (pFVar3 == (FIRSTPASS_STATS *)0x0) break;
      dVar14 = (double)frame_info->frame_height;
      accumulate_frame_motion_stats(pFVar1,&local_c8,(double)frame_info->frame_width,dVar14);
      iVar7 = detect_flash(pTVar4,(TWO_PASS_FRAME *)pFVar3,(int)lVar10);
      if ((iVar7 == 0) &&
         (iVar7 = detect_flash(pTVar4,(TWO_PASS_FRAME *)pFVar3,(int)lVar10 + 1),
         dVar6 = local_c8.decay_accumulator, iVar7 == 0)) {
        dVar5 = get_prediction_decay_rate(pFVar1);
        dVar5 = dVar5 * dVar6;
        dVar14 = 0.01;
        local_c8.decay_accumulator = 0.01;
        if (0.01 <= dVar5) {
          dVar14 = dVar5;
          local_c8.decay_accumulator = dVar5;
        }
      }
      dVar6 = local_c8.decay_accumulator;
      dVar14 = calc_frame_boost((PRIMARY_RATE_CONTROL *)(ulong)(uint)p_rc->avg_frame_qindex[1],
                                frame_info,pFVar1,local_c8.this_frame_mv_in_out,dVar14);
      if (num_fpstats_used != (int *)0x0) {
        *num_fpstats_used = *num_fpstats_used + 1;
      }
      dVar13 = dVar13 + dVar6 * dVar14;
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 0xe8;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    iVar7 = (int)dVar13;
  }
  local_c8.gf_group_skip_pct = 0.0;
  local_c8.gf_group_inactive_zone_rows = 0.0;
  local_c8.gf_group_err = 0.0;
  local_c8.gf_group_raw_error = 0.0;
  local_c8.mv_ratio_accumulator = 0.0;
  local_c8.decay_accumulator = 1.0;
  local_c8.zero_motion_accumulator = 1.0;
  local_c8.loop_decay_rate = 1.0;
  local_c8.last_loop_decay_rate = 1.0;
  local_c8.avg_wavelet_energy = 0.0;
  local_c8.avg_raw_err_stdev = 0.0;
  local_c8.avg_pcnt_second_ref = 0.0;
  local_c8.avg_new_mv_count = 0.0;
  local_c8.abs_mv_in_out_accumulator = 0.0;
  local_c8.avg_sr_coded_error = 0.0;
  local_c8.this_frame_mv_in_out = 0.0;
  local_c8.mv_in_out_accumulator = 0.0;
  local_c8.non_zero_stdev_count = 0;
  if (b_frames < 1) {
    iVar8 = 0;
  }
  else {
    dVar13 = 0.0;
    lVar12 = 0;
    lVar10 = lVar9 * 0xe8;
    do {
      pFVar3 = twopass_frame->stats_in;
      pFVar1 = (FIRSTPASS_STATS *)((long)&pFVar3[-1].frame + lVar10);
      pTVar4 = (TWO_PASS *)twopass->stats_buf_ctx;
      if (lVar9 + -1 + lVar12 < 0) {
        if (pFVar1 < *(FIRSTPASS_STATS **)pTVar4) break;
      }
      else if (pTVar4->frame_stats_arr[0] <= pFVar1) break;
      if (pFVar3 == (FIRSTPASS_STATS *)0x0) break;
      dVar14 = (double)frame_info->frame_height;
      accumulate_frame_motion_stats(pFVar1,&local_c8,(double)frame_info->frame_width,dVar14);
      iVar8 = detect_flash(pTVar4,(TWO_PASS_FRAME *)pFVar3,offset + -1 + (int)lVar12);
      if ((iVar8 == 0) &&
         (iVar8 = detect_flash(pTVar4,(TWO_PASS_FRAME *)pFVar3,offset + (int)lVar12),
         dVar6 = local_c8.decay_accumulator, iVar8 == 0)) {
        dVar5 = get_prediction_decay_rate(pFVar1);
        dVar5 = dVar5 * dVar6;
        dVar14 = 0.01;
        local_c8.decay_accumulator = 0.01;
        if (0.01 <= dVar5) {
          dVar14 = dVar5;
          local_c8.decay_accumulator = dVar5;
        }
      }
      dVar6 = local_c8.decay_accumulator;
      dVar14 = calc_frame_boost((PRIMARY_RATE_CONTROL *)(ulong)(uint)p_rc->avg_frame_qindex[1],
                                frame_info,pFVar1,local_c8.this_frame_mv_in_out,dVar14);
      if (num_fpstats_used != (int *)0x0) {
        *num_fpstats_used = *num_fpstats_used + 1;
      }
      dVar13 = dVar13 + dVar6 * dVar14;
      lVar12 = lVar12 + -1;
      lVar10 = lVar10 + -0xe8;
    } while (-b_frames < lVar12);
    iVar8 = (int)dVar13;
  }
  iVar8 = iVar8 + iVar7;
  iVar7 = b_frames + f_frames;
  if (project_gfu_boost != 0) {
    *num_fpstats_required = iVar7;
    iVar2 = *num_fpstats_used;
    if (iVar2 < iVar7) {
      dVar13 = (double)p_rc->baseline_gf_interval;
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      dVar14 = (double)iVar7;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      if (10.0 <= dVar14) {
        dVar14 = 10.0;
      }
      if (dVar14 <= dVar13) {
        dVar14 = dVar13;
      }
      dVar6 = (double)iVar2;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      if (10.0 <= dVar6) {
        dVar6 = 10.0;
      }
      if (dVar6 <= dVar13) {
        dVar6 = dVar13;
      }
      dVar13 = rint(((dVar14 * 10.0 + 200.0) * (double)iVar8) / (dVar6 * 10.0 + 200.0));
      iVar8 = (int)dVar13;
    }
  }
  iVar2 = iVar7 * 0x32;
  if (iVar7 * 0x32 < iVar8) {
    iVar2 = iVar8;
  }
  return iVar2;
}

Assistant:

int av1_calc_arf_boost(const TWO_PASS *twopass,
                       const TWO_PASS_FRAME *twopass_frame,
                       const PRIMARY_RATE_CONTROL *p_rc, FRAME_INFO *frame_info,
                       int offset, int f_frames, int b_frames,
                       int *num_fpstats_used, int *num_fpstats_required,
                       int project_gfu_boost) {
  int i;
  GF_GROUP_STATS gf_stats;
  init_gf_stats(&gf_stats);
  double boost_score = (double)NORMAL_BOOST;
  int arf_boost;
  int flash_detected = 0;
  if (num_fpstats_used) *num_fpstats_used = 0;

  // Search forward from the proposed arf/next gf position.
  for (i = 0; i < f_frames; ++i) {
    const FIRSTPASS_STATS *this_frame =
        read_frame_stats(twopass, twopass_frame, i + offset);
    if (this_frame == NULL) break;

    // Update the motion related elements to the boost calculation.
    accumulate_frame_motion_stats(this_frame, &gf_stats,
                                  frame_info->frame_width,
                                  frame_info->frame_height);

    // We want to discount the flash frame itself and the recovery
    // frame that follows as both will have poor scores.
    flash_detected = detect_flash(twopass, twopass_frame, i + offset) ||
                     detect_flash(twopass, twopass_frame, i + offset + 1);

    // Accumulate the effect of prediction quality decay.
    if (!flash_detected) {
      gf_stats.decay_accumulator *= get_prediction_decay_rate(this_frame);
      gf_stats.decay_accumulator = gf_stats.decay_accumulator < MIN_DECAY_FACTOR
                                       ? MIN_DECAY_FACTOR
                                       : gf_stats.decay_accumulator;
    }

    boost_score +=
        gf_stats.decay_accumulator *
        calc_frame_boost(p_rc, frame_info, this_frame,
                         gf_stats.this_frame_mv_in_out, GF_MAX_BOOST);
    if (num_fpstats_used) (*num_fpstats_used)++;
  }

  arf_boost = (int)boost_score;

  // Reset for backward looking loop.
  boost_score = 0.0;
  init_gf_stats(&gf_stats);
  // Search backward towards last gf position.
  for (i = -1; i >= -b_frames; --i) {
    const FIRSTPASS_STATS *this_frame =
        read_frame_stats(twopass, twopass_frame, i + offset);
    if (this_frame == NULL) break;

    // Update the motion related elements to the boost calculation.
    accumulate_frame_motion_stats(this_frame, &gf_stats,
                                  frame_info->frame_width,
                                  frame_info->frame_height);

    // We want to discount the the flash frame itself and the recovery
    // frame that follows as both will have poor scores.
    flash_detected = detect_flash(twopass, twopass_frame, i + offset) ||
                     detect_flash(twopass, twopass_frame, i + offset + 1);

    // Cumulative effect of prediction quality decay.
    if (!flash_detected) {
      gf_stats.decay_accumulator *= get_prediction_decay_rate(this_frame);
      gf_stats.decay_accumulator = gf_stats.decay_accumulator < MIN_DECAY_FACTOR
                                       ? MIN_DECAY_FACTOR
                                       : gf_stats.decay_accumulator;
    }

    boost_score +=
        gf_stats.decay_accumulator *
        calc_frame_boost(p_rc, frame_info, this_frame,
                         gf_stats.this_frame_mv_in_out, GF_MAX_BOOST);
    if (num_fpstats_used) (*num_fpstats_used)++;
  }
  arf_boost += (int)boost_score;

  if (project_gfu_boost) {
    assert(num_fpstats_required != NULL);
    assert(num_fpstats_used != NULL);
    *num_fpstats_required = f_frames + b_frames;
    arf_boost = get_projected_gfu_boost(p_rc, arf_boost, *num_fpstats_required,
                                        *num_fpstats_used);
  }

  if (arf_boost < ((b_frames + f_frames) * GF_MIN_BOOST))
    arf_boost = ((b_frames + f_frames) * GF_MIN_BOOST);

  return arf_boost;
}